

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImAtoi<int>(char *src,int *output)

{
  bool bVar1;
  int local_28;
  int local_20;
  int v;
  int negative;
  int *output_local;
  char *src_local;
  
  output_local = (int *)src;
  if (*src == '-') {
    output_local = (int *)(src + 1);
  }
  if ((char)*output_local == '+') {
    output_local = (int *)((long)output_local + 1);
  }
  local_20 = 0;
  while( true ) {
    bVar1 = false;
    if ('/' < (char)*output_local) {
      bVar1 = (char)*output_local < ':';
    }
    if (!bVar1) break;
    local_20 = local_20 * 10 + (char)*output_local + -0x30;
    output_local = (int *)((long)output_local + 1);
  }
  if (*src == '-') {
    local_28 = -local_20;
  }
  else {
    local_28 = local_20;
  }
  *output = local_28;
  return (char *)output_local;
}

Assistant:

static const char* ImAtoi(const char* src, TYPE* output)
{
    int negative = 0;
    if (*src == '-') { negative = 1; src++; }
    if (*src == '+') { src++; }
    TYPE v = 0;
    while (*src >= '0' && *src <= '9')
        v = (v * 10) + (*src++ - '0');
    *output = negative ? -v : v;
    return src;
}